

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslserver.cpp
# Opt level: O3

void __thiscall QSslServerPrivate::checkClientHelloAndContinue(QSslServerPrivate *this)

{
  byte bVar1;
  long lVar2;
  QObject *pQVar3;
  Entry *pEVar4;
  char cVar5;
  QSslSocket *this_00;
  long lVar6;
  Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> *pDVar7;
  ulong uVar8;
  uint uVar9;
  long in_FS_OFFSET;
  iterator iVar10;
  char byte;
  Connection local_50;
  Connection __old_val;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = *(QObject **)&(this->super_QTcpServerPrivate).field_0x8;
  QObject::sender();
  this_00 = (QSslSocket *)QMetaObject::cast((QObject *)&QSslSocket::staticMetaObject);
  if (this_00 == (QSslSocket *)0x0) goto LAB_0016f666;
  lVar6 = (**(code **)(*(long *)&(this_00->super_QTcpSocket).super_QAbstractSocket + 0xa0))(this_00)
  ;
  if (lVar6 < 1) goto LAB_0016f666;
  byte = '\0';
  lVar6 = QIODevice::peek((char *)this_00,(longlong)&byte);
  if (lVar6 == 1) {
    __old_val.d_ptr = this_00;
    iVar10 = QHash<unsigned_long_long,_QSslServerPrivate::SocketData>::findImpl<unsigned_long_long>
                       (&this->socketData,(unsigned_long_long *)&__old_val);
    pDVar7 = iVar10.i.d;
    if (pDVar7 == (Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> *)
                  0x0 && iVar10.i.bucket == 0) {
      if (byte != '\x16') goto LAB_0016f652;
    }
    else {
      uVar8 = iVar10.i.bucket >> 7;
      uVar9 = (uint)iVar10.i.bucket & 0x7f;
      if (*(long *)(pDVar7->spans[uVar8].entries[pDVar7->spans[uVar8].offsets[uVar9]].storage.data +
                   8) != 0) {
        cVar5 = QMetaObject::Connection::isConnected_helper();
        if (cVar5 != '\0') {
          pEVar4 = pDVar7->spans[uVar8].entries;
          bVar1 = pDVar7->spans[uVar8].offsets[uVar9];
          QMetaObject::Connection::Connection(&local_50);
          __old_val.d_ptr = *(void **)(pEVar4[bVar1].storage.data + 8);
          *(void **)(pEVar4[bVar1].storage.data + 8) = local_50.d_ptr;
          local_50.d_ptr = (QSslSocket *)0x0;
          QObject::disconnect(&__old_val);
          QMetaObject::Connection::~Connection(&__old_val);
          QMetaObject::Connection::~Connection(&local_50);
        }
      }
      if (byte != '\x16') {
LAB_0016f652:
        (**(code **)(*(long *)&(this_00->super_QTcpSocket).super_QAbstractSocket + 0x100))(this_00);
        goto LAB_0016f65e;
      }
      QTimer::start();
    }
    QSslSocket::startServerEncryption(this_00);
    __old_val.d_ptr = (void *)0x0;
    local_50.d_ptr = this_00;
    QMetaObject::activate(pQVar3,&QSslServer::staticMetaObject,7,&__old_val.d_ptr);
  }
  else {
LAB_0016f65e:
    QObject::deleteLater();
  }
LAB_0016f666:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslServerPrivate::checkClientHelloAndContinue()
{
    Q_Q(QSslServer);
    QSslSocket *socket = qobject_cast<QSslSocket *>(q->sender());
    if (Q_UNLIKELY(!socket) || socket->bytesAvailable() <= 0)
        return;

    char byte = '\0';
    if (socket->peek(&byte, 1) != 1) {
        socket->deleteLater();
        return;
    }

    auto it = socketData.find(quintptr(socket));
    const bool foundData = it != socketData.end();
    if (foundData && it->readyReadConnection)
        QObject::disconnect(std::exchange(it->readyReadConnection, {}));

    constexpr char CLIENT_HELLO = 0x16;
    if (byte != CLIENT_HELLO) {
        socket->disconnectFromHost();
        socket->deleteLater();
        return;
    }

    // Be nice and restart the timeout timer since some progress was made
    if (foundData)
        it->timeoutTimer->start();

    socket->startServerEncryption();
    Q_EMIT q->startedEncryptionHandshake(socket);
}